

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O0

mk_rconf_section * mk_rconf_section_get(mk_rconf *conf,char *name)

{
  int iVar1;
  mk_list **ppmVar2;
  mk_list *__mptr;
  mk_rconf_section *section;
  mk_list *head;
  char *name_local;
  mk_rconf *conf_local;
  
  section = (mk_rconf_section *)(conf->sections).next;
  while( true ) {
    if (section == (mk_rconf_section *)&conf->sections) {
      return (mk_rconf_section *)0x0;
    }
    ppmVar2 = &section[-1].entries.next;
    iVar1 = strcasecmp((char *)*ppmVar2,name);
    if (iVar1 == 0) break;
    section = (mk_rconf_section *)(section->entries).prev;
  }
  return (mk_rconf_section *)ppmVar2;
}

Assistant:

struct mk_rconf_section *mk_rconf_section_get(struct mk_rconf *conf,
                                              const char *name)
{
    struct mk_list *head;
    struct mk_rconf_section *section;

    mk_list_foreach(head, &conf->sections) {
        section = mk_list_entry(head, struct mk_rconf_section, _head);
        if (strcasecmp(section->name, name) == 0) {
            return section;
        }
    }

    return NULL;
}